

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

int __thiscall
NNTreeImpl::withinLimits(NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *node)

{
  NNTreeDetails *pNVar1;
  QPDF *qpdf;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined8 extraout_RAX;
  uint uVar5;
  QPDFObjectHandle QVar6;
  allocator<char> local_b9;
  QPDFObjectHandle limits;
  QPDFObjectHandle local_a8;
  QPDFObjectHandle local_98;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_88;
  QPDFObjectHandle local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68;
  QPDFObjectHandle local_58;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/Limits",&local_b9);
  QPDFObjectHandle::getKey(&limits,(string *)node);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = QPDFObjectHandle::isArray(&limits);
  if (bVar2) {
    iVar4 = QPDFObjectHandle::getArrayNItems(&limits);
    if (1 < iVar4) {
      pNVar1 = this->details;
      QVar6 = QPDFObjectHandle::getArrayItem(&local_a8,(int)&limits);
      cVar3 = (**(code **)(*(long *)pNVar1 + 8))
                        (pNVar1,&local_a8,
                         QVar6.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
      if (cVar3 == '\0') {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        pNVar1 = this->details;
        QVar6 = QPDFObjectHandle::getArrayItem(&local_58,(int)&limits);
        cVar3 = (**(code **)(*(long *)pNVar1 + 8))
                          (pNVar1,&local_58,
                           QVar6.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_58.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        if (cVar3 != '\0') {
          pNVar1 = this->details;
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_68,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
          QPDFObjectHandle::getArrayItem(&local_78,(int)&limits);
          iVar4 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_68,&local_78);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_78.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
          if (iVar4 < 0) {
            uVar5 = 0xffffffff;
          }
          else {
            pNVar1 = this->details;
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_88,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
            QPDFObjectHandle::getArrayItem(&local_98,(int)&limits);
            iVar4 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_88,&local_98);
            uVar5 = (uint)(0 < iVar4);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_98.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&limits.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          return uVar5;
        }
      }
    }
  }
  qpdf = this->qpdf;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"node is missing /Limits",&local_b9);
  ::error(qpdf,node,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&limits.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
NNTreeImpl::withinLimits(QPDFObjectHandle key, QPDFObjectHandle node)
{
    int result = 0;
    auto limits = node.getKey("/Limits");
    if (limits.isArray() && (limits.getArrayNItems() >= 2) &&
        details.keyValid(limits.getArrayItem(0)) && details.keyValid(limits.getArrayItem(1))) {
        if (details.compareKeys(key, limits.getArrayItem(0)) < 0) {
            result = -1;
        } else if (details.compareKeys(key, limits.getArrayItem(1)) > 0) {
            result = 1;
        }
    } else {
        QTC::TC("qpdf", "NNTree missing limits");
        error(qpdf, node, "node is missing /Limits");
    }
    return result;
}